

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageLoop.cpp
# Opt level: O2

void __thiscall loop::MessageLoop::~MessageLoop(MessageLoop *this)

{
  SharedSemaphore *this_00;
  TaskInfo *pTVar1;
  undefined1 in_AL;
  bool bVar2;
  undefined7 in_register_00000001;
  TaskInfo *task;
  TaskInfo *local_28;
  
  local_28 = (TaskInfo *)CONCAT71(in_register_00000001,in_AL);
  while( true ) {
    bVar2 = moodycamel::
            ConcurrentQueue<loop::MessageLoop::TaskInfo*,moodycamel::ConcurrentQueueDefaultTraits>::
            try_dequeue<loop::MessageLoop::TaskInfo*>
                      ((ConcurrentQueue<loop::MessageLoop::TaskInfo*,moodycamel::ConcurrentQueueDefaultTraits>
                        *)&this->m_quque,&local_28);
    pTVar1 = local_28;
    if (!bVar2) break;
    if (local_28 != (TaskInfo *)0x0) {
      std::_Function_base::~_Function_base(&(local_28->task).super__Function_base);
    }
    operator_delete(pTVar1);
  }
  this_00 = this->m_sem;
  if (this_00 != (SharedSemaphore *)0x0) {
    myutils::SharedSemaphore::~SharedSemaphore(this_00);
  }
  operator_delete(this_00);
  moodycamel::
  ConcurrentQueue<loop::MessageLoop::TaskInfo_*,_moodycamel::ConcurrentQueueDefaultTraits>::
  ~ConcurrentQueue(&this->m_quque);
  moodycamel::ConcurrentQueue<unsigned_int,_moodycamel::ConcurrentQueueDefaultTraits>::
  ~ConcurrentQueue(&this->m_deleted_queue);
  return;
}

Assistant:

MessageLoop::~MessageLoop()
{
    TaskInfo* task;
    while (m_quque.try_dequeue(task)) delete task;
    delete m_sem;
}